

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
PatchCredits::build_credits_bytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PatchCredits *this)

{
  pointer puVar1;
  ulong uVar2;
  LandstalkerException *this_00;
  ulong uVar3;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rando_credits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> landstalker_randomizer;
  allocator_type local_e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  string local_b8 [4];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (this->_original_credits).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,0,puVar1,
             puVar1 + 0x75);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[2] = '\x13';
  local_b8[0]._M_dataplus._M_p = (pointer)0x271c2f2e1f291c27;
  local_b8[0]._M_string_length._0_6_ = 0x1c2d802d2026;
  local_b8[0]._M_string_length._6_2_ = 0x1f29;
  local_b8[0].field_2._M_allocated_capacity._0_6_ = 0x2d203524282a;
  __l._M_len = 0x16;
  __l._M_array = (iterator)local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_d0,__l,(allocator_type *)&local_e8);
  if ((long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove((__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start + 0x14,
            local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[0x5c] = '\x0f';
  memcpy(local_b8,&DAT_0021adea,0x8c);
  __l_00._M_len = 0x8c;
  __l_00._M_array = (iterator)local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e8,__l_00,&local_e9);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  puVar1 = (this->_original_credits).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,puVar1 + 0x1d3,puVar1 + 0x929);
  uVar2 = (long)(__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar3 = (long)(this->_original_credits).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_original_credits).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar2 < uVar3) {
    do {
      local_b8[0]._M_dataplus._M_p = local_b8[0]._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)local_b8);
      uVar2 = (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      uVar3 = (long)(this->_original_credits).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->_original_credits).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    } while (uVar2 < uVar3);
  }
  if (uVar2 <= uVar3) {
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"New credits cannot be bigger than original credits","");
  LandstalkerException::LandstalkerException(this_00,local_b8);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

[[nodiscard]] std::vector<uint8_t> build_credits_bytes() const
    {
        std::vector<uint8_t> new_credits_text;

        new_credits_text.insert(new_credits_text.begin(), _original_credits.begin(), _original_credits.begin() + 0x75);

        // Change "LANDSTALKER" to "RANDSTALKER"
        new_credits_text[0x2] = 0x13;

        std::vector<uint8_t> landstalker_randomizer = {
                0x27, 0x1C, 0x29, 0x1F, 0x2E, 0x2F, 0x1C, 0x27, 0x26, 0x20, 0x2D, 0x80, // "landstalker "
                0x2D, 0x1C, 0x29, 0x1F, 0x2A, 0x28, 0x24, 0x35, 0x20, 0x2D              // "randomizer"
        };
        std::copy(landstalker_randomizer.begin(), landstalker_randomizer.end(), new_credits_text.begin() + 0x14);

        // Widen the space between the end of the cast and the beginning of the rando staff
        new_credits_text[0x5C] = 0x0F;

        // Replace the "game cast" (useless list of game characters) by the randomizer credits
        std::vector<uint8_t> rando_credits = {
                // " R A N D O M I Z E R "
                0x08, 0xFF, 0x82,
                0x80, 0x13, 0x80, 0x02, 0x80, 0x0F, 0x80, 0x05, 0x80, 0x10, 0x80, 0x0E, 0x80, 0x0A, 0x80, 0x1B, 0x80, 0x06, 0x80, 0x13, 0x80, 0x00,
                // "developed by"
                0x04, 0xFF, 0x81,
                0x1F, 0x20, 0x31, 0x20, 0x27, 0x2A, 0x2B, 0x20, 0x1F, 0x80, 0x1D, 0x34, 0x00,
                // "DINOPONY"
                0x03, 0xFF,
                0x05, 0x0A, 0x0F, 0x10, 0x11, 0x10, 0x0F, 0x1A, 0x00,
                // "WIZ"
                0x08, 0xFF,
                0x18, 0x0A, 0x1B, 0x00,
                // "testing"
                0x04, 0xFF, 0x81,
                0x2F, 0x20, 0x2E, 0x2F, 0x24, 0x29, 0x22, 0x00,
                // "SAGAZ"
                0x03, 0xFF,
                0x14, 0x02, 0x08, 0x02, 0x1B, 0x00,
                // "STIK"
                0x03, 0xFF,
                0x14, 0x15, 0x0A, 0x0C, 0x00,
                // "HAWKREX"
                0x03, 0xFF,
                0x09, 0x02, 0x18, 0x0C, 0x13, 0x06, 0x19, 0x00,
                // "LANDRYLE"
                0x03, 0xFF,
                0x0D, 0x02, 0x0F, 0x05, 0x13, 0x1A, 0x0D, 0x06, 0x00,
                // "SORCIER"
                0x08, 0xFF,
                0x14, 0x10, 0x13, 0x04, 0x0A, 0x06, 0x13, 0x00,
                // "disassembly"
                0x04, 0xFF, 0x81,
                0x1F, 0x24, 0x2E, 0x1C, 0x2E, 0x2E, 0x20, 0x28, 0x1D, 0x27, 0x34, 0x00,
                // "LORDMIR"
                0x08, 0xFF,
                0x0D, 0x10, 0x13, 0x05, 0x0E, 0x0A, 0x13, 0x00,
        };
        new_credits_text.insert(new_credits_text.end(), rando_credits.begin(), rando_credits.end());

        // Add the rest of the original game credits
        new_credits_text.insert(new_credits_text.end(), _original_credits.begin() + 0x1D3, _original_credits.begin() + 0x929);

        while(new_credits_text.size() < _original_credits.size())
            new_credits_text.emplace_back(0x00);
        if(new_credits_text.size() > _original_credits.size())
            throw LandstalkerException("New credits cannot be bigger than original credits");

        return new_credits_text;
    }